

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  spdlog_ex *this_00;
  int *piVar2;
  undefined4 in_register_00000034;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *data;
  size_t msg_size;
  log_msg *msg_local;
  file_helper *this_local;
  
  msg_size = CONCAT44(in_register_00000034,__fd);
  msg_local = (log_msg *)this;
  data = (char *)fmt::BasicWriter<char>::size((BasicWriter<char> *)(msg_size + 0x248));
  local_28 = fmt::BasicWriter<char>::data((BasicWriter<char> *)(msg_size + 0x248));
  pcVar1 = (char *)fwrite(local_28,1,(size_t)data,(FILE *)this->_fd);
  if (pcVar1 != data) {
    this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    os::filename_to_str(&local_68,&this->_filename);
    std::operator+(&local_48,"Failed writing to file ",&local_68);
    piVar2 = __errno_location();
    spdlog_ex::spdlog_ex(this_00,&local_48,*piVar2);
    __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  return (ssize_t)pcVar1;
}

Assistant:

void write(const log_msg &msg)
    {
        size_t msg_size = msg.formatted.size();
        auto data = msg.formatted.data();
        if (std::fwrite(data, 1, msg_size, _fd) != msg_size)
        {
            throw spdlog_ex("Failed writing to file " + os::filename_to_str(_filename), errno);
        }
    }